

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

int SUNClassicalGS(N_Vector *v,realtype **h,int k,int p,realtype *new_vk_norm,realtype *stemp,
                  N_Vector *vtemp)

{
  N_Vector z;
  uint nvec;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  realtype rVar6;
  double dVar7;
  realtype rVar8;
  double dVar9;
  
  nvec = p;
  if (k < p) {
    nvec = k;
  }
  uVar5 = 0;
  if (0 < k - p) {
    uVar5 = (ulong)(uint)(k - p);
  }
  lVar3 = (long)k;
  iVar1 = N_VDotProdMulti(nvec + 1,v[lVar3],v + uVar5,stemp);
  if (iVar1 != 0) {
    return -1;
  }
  iVar1 = k + -1;
  dVar7 = stemp[(int)nvec];
  dVar9 = 0.0;
  if (0.0 < dVar7) {
    if (dVar7 < 0.0) {
      dVar9 = sqrt(dVar7);
    }
    else {
      dVar9 = SQRT(dVar7);
    }
  }
  if (lVar3 <= p) {
    p = k;
  }
  for (lVar4 = 0; 0 < p + (int)lVar4; lVar4 = lVar4 + -1) {
    rVar6 = stemp[(ulong)nvec + lVar4 + -1];
    h[(ulong)nvec + lVar4 + -1][iVar1] = rVar6;
    stemp[(ulong)nvec + lVar4] = -rVar6;
    vtemp[(ulong)nvec + lVar4] = v[(ulong)nvec + lVar4 + -1];
  }
  *stemp = 1.0;
  z = v[lVar3];
  *vtemp = z;
  iVar2 = N_VLinearCombination(nvec + 1,stemp,vtemp,z);
  if (iVar2 == 0) {
    rVar6 = N_VDotProd(v[lVar3],v[lVar3]);
    dVar7 = 0.0;
    if (0.0 < rVar6) {
      rVar6 = N_VDotProd(v[lVar3],v[lVar3]);
      if (rVar6 < 0.0) {
        dVar7 = sqrt(rVar6);
      }
      else {
        dVar7 = SQRT(rVar6);
      }
    }
    *new_vk_norm = dVar7;
    if (dVar9 <= dVar7 * 1000.0) {
      return 0;
    }
    iVar2 = N_VDotProdMulti(nvec,v[lVar3],v + uVar5,stemp + 1);
    if (iVar2 == 0) {
      *stemp = 1.0;
      *vtemp = v[lVar3];
      for (lVar4 = 0; (long)(uVar5 + lVar4) < lVar3; lVar4 = lVar4 + 1) {
        h[uVar5 + lVar4][iVar1] = stemp[lVar4 + 1] + h[uVar5 + lVar4][iVar1];
        stemp[lVar4 + 1] = -stemp[lVar4 + 1];
        vtemp[lVar4 + 1] = v[lVar4];
      }
      iVar1 = N_VLinearCombination(k + 1,stemp,vtemp,v[lVar3]);
      if (iVar1 != 0) {
        return -1;
      }
      rVar6 = N_VDotProd(v[lVar3],v[lVar3]);
      rVar8 = 0.0;
      if (0.0 < rVar6) {
        rVar8 = N_VDotProd(v[lVar3],v[lVar3]);
        if (rVar8 < 0.0) {
          rVar8 = sqrt(rVar8);
        }
        else {
          rVar8 = SQRT(rVar8);
        }
      }
      *new_vk_norm = rVar8;
      return 0;
    }
  }
  return -1;
}

Assistant:

int SUNClassicalGS(N_Vector *v, realtype **h, int k, int p, realtype *new_vk_norm,
                   realtype *stemp, N_Vector *vtemp)
{
  int  i, i0, k_minus_1, retval;
  realtype vk_norm;

  k_minus_1 = k - 1;
  i0 = SUNMAX(k-p,0);

  /* Perform Classical Gram-Schmidt */

  retval = N_VDotProdMulti(k-i0+1, v[k], v+i0, stemp);
  if (retval != 0) return(-1);

  vk_norm = SUNRsqrt(stemp[k-i0]);
  for (i=k-i0-1; i >= 0; i--) {
    h[i][k_minus_1] = stemp[i];
    stemp[i+1] = -stemp[i];
    vtemp[i+1] = v[i];
  }
  stemp[0] = ONE;
  vtemp[0] = v[k];

  retval = N_VLinearCombination(k-i0+1, stemp, vtemp, v[k]);
  if (retval != 0) return(-1);

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));

  /* Reorthogonalize if necessary */

  if ((FACTOR * (*new_vk_norm)) < vk_norm) {

    retval = N_VDotProdMulti(k-i0, v[k], v+i0, stemp+1);
    if (retval != 0) return(-1);

    stemp[0] = ONE;
    vtemp[0] = v[k];
    for (i=i0; i < k; i++) {
      h[i][k_minus_1] += stemp[i-i0+1];
      stemp[i-i0+1] = -stemp[i-i0+1];
      vtemp[i-i0+1] = v[i-i0];
    }

    retval = N_VLinearCombination(k+1, stemp, vtemp, v[k]);
    if (retval != 0) return(-1);

    *new_vk_norm = SUNRsqrt(N_VDotProd(v[k],v[k]));
  }

  return(0);
}